

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O2

lws_spa * lws_spa_create_via_info(lws *wsi,lws_spa_create_info_t *i)

{
  byte bVar1;
  lws_spa_fileupload_cb p_Var2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  lws_spa *spa;
  char *pcVar7;
  char **ppcVar8;
  lws_urldecode_stateful *plVar9;
  long lVar10;
  int *piVar11;
  char *pcVar12;
  size_t sVar13;
  lwsac **pplVar14;
  char acStack_108 [216];
  
  if (i->ac == (lwsac **)0x0) {
    spa = (lws_spa *)lws_zalloc(0x68,"spa");
  }
  else {
    spa = (lws_spa *)lwsac_use_zero(i->ac,0x68,i->ac_chunk_size);
  }
  if (spa == (lws_spa *)0x0) {
    return (lws_spa *)0x0;
  }
  iVar6 = i->count_params;
  iVar4 = i->max_storage;
  p_Var2 = i->opt_cb;
  pvVar3 = i->opt_data;
  sVar13 = i->param_names_stride;
  pplVar14 = i->ac;
  (spa->i).param_names = i->param_names;
  (spa->i).count_params = iVar6;
  (spa->i).max_storage = iVar4;
  (spa->i).ac_chunk_size = i->ac_chunk_size;
  (spa->i).param_names_stride = sVar13;
  (spa->i).ac = pplVar14;
  (spa->i).opt_cb = p_Var2;
  (spa->i).opt_data = pvVar3;
  uVar5 = (spa->i).max_storage;
  if (uVar5 == 0) {
    (spa->i).max_storage = 0x200;
    uVar5 = 0x200;
  }
  if (i->ac == (lwsac **)0x0) {
    pcVar7 = (char *)lws_realloc((void *)0x0,(ulong)uVar5,"spa");
  }
  else {
    pcVar7 = (char *)lwsac_use(i->ac,(ulong)uVar5,i->ac_chunk_size);
  }
  spa->storage = pcVar7;
  if (pcVar7 != (char *)0x0) {
    iVar6 = i->max_storage;
    spa->end = pcVar7 + (long)iVar6 + -1;
    if ((ulong)(uint)i->count_params == 0) {
LAB_00120315:
      pplVar14 = (spa->i).ac;
      if (pplVar14 == (lwsac **)0x0) {
        plVar9 = (lws_urldecode_stateful *)lws_zalloc(0x240,"stateful urldecode");
      }
      else {
        plVar9 = (lws_urldecode_stateful *)lwsac_use_zero(pplVar14,0x240,(spa->i).ac_chunk_size);
      }
      if (plVar9 == (lws_urldecode_stateful *)0x0) {
        spa->s = (lws_urldecode_stateful *)0x0;
      }
      else {
        plVar9->out = pcVar7;
        plVar9->out_len = iVar6;
        plVar9->output = lws_urldecode_spa_cb;
        plVar9->pos = 0;
        plVar9->mp = 0;
        plVar9->sum = 0;
        plVar9->state = US_NAME;
        plVar9->name[0] = '\0';
        plVar9->data = spa;
        plVar9->wsi = wsi;
        iVar6 = lws_hdr_copy(wsi,acStack_108,0xcd,WSI_TOKEN_HTTP_CONTENT_TYPE);
        if ((0 < iVar6) &&
           ((iVar6 = bcmp(acStack_108,"multipart/form-data",0x13), iVar6 == 0 ||
            (iVar6 = bcmp(acStack_108,"multipart/related",0x11), iVar6 == 0)))) {
          plVar9->field_0x22d = plVar9->field_0x22d | 1;
          plVar9->state = MT_LOOK_BOUND_IN;
          plVar9->mp = 2;
          pcVar7 = strstr(acStack_108,"boundary=");
          if (pcVar7 != (char *)0x0) {
            builtin_strncpy(plVar9->mime_boundary,"\r\n--",4);
            pcVar12 = pcVar7 + 10;
            if (pcVar7[9] != '\"') {
              pcVar12 = pcVar7 + 9;
            }
            for (lVar10 = 0; lVar10 != 0x7b; lVar10 = lVar10 + 1) {
              bVar1 = pcVar12[lVar10];
              if (((ulong)bVar1 < 0x3c) && ((0x800000500000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
              break;
              plVar9->mime_boundary[lVar10 + 4] = bVar1;
            }
            plVar9->mime_boundary[lVar10 + 4] = '\0';
          }
        }
        spa->s = plVar9;
        if ((ulong)(uint)i->count_params == 0) {
          return spa;
        }
        sVar13 = (ulong)(uint)i->count_params << 2;
        if (i->ac == (lwsac **)0x0) {
          piVar11 = (int *)lws_zalloc(sVar13,"spa param len");
        }
        else {
          piVar11 = (int *)lwsac_use_zero(i->ac,sVar13,i->ac_chunk_size);
        }
        spa->param_length = piVar11;
        if (piVar11 != (int *)0x0) {
          return spa;
        }
        lws_urldecode_s_destroy(spa,spa->s);
      }
      pplVar14 = i->ac;
      if (pplVar14 != (lwsac **)0x0) goto LAB_0012051a;
      lws_realloc(spa->params,0,"lws_free");
    }
    else {
      sVar13 = (ulong)(uint)i->count_params << 3;
      if (i->ac == (lwsac **)0x0) {
        ppcVar8 = (char **)lws_zalloc(sVar13,"spa params");
      }
      else {
        ppcVar8 = (char **)lwsac_use_zero(i->ac,sVar13,i->ac_chunk_size);
      }
      spa->params = ppcVar8;
      if (ppcVar8 != (char **)0x0) {
        pcVar7 = spa->storage;
        iVar6 = i->max_storage;
        goto LAB_00120315;
      }
    }
    pplVar14 = i->ac;
    if (pplVar14 != (lwsac **)0x0) goto LAB_0012051a;
    lws_realloc(spa->storage,0,"lws_free");
  }
  pplVar14 = i->ac;
  if (pplVar14 == (lwsac **)0x0) {
    lws_realloc(spa,0,"lws_free");
    pplVar14 = i->ac;
    if (pplVar14 == (lwsac **)0x0) {
      return (lws_spa *)0x0;
    }
  }
LAB_0012051a:
  lwsac_free(pplVar14);
  return (lws_spa *)0x0;
}

Assistant:

struct lws_spa *
lws_spa_create_via_info(struct lws *wsi, const lws_spa_create_info_t *i)
{
	struct lws_spa *spa;

	if (i->ac)
		spa = lwsac_use_zero(i->ac, sizeof(*spa), i->ac_chunk_size);
	else
		spa = lws_zalloc(sizeof(*spa), "spa");

	if (!spa)
		return NULL;

	spa->i = *i;
	if (!spa->i.max_storage)
		spa->i.max_storage = 512;

	if (i->ac)
		spa->storage = lwsac_use(i->ac, (unsigned int)spa->i.max_storage,
					 i->ac_chunk_size);
	else
		spa->storage = lws_malloc((unsigned int)spa->i.max_storage, "spa");

	if (!spa->storage)
		goto bail2;

	spa->end = spa->storage + i->max_storage - 1;

	if (i->count_params) {
		if (i->ac)
			spa->params = lwsac_use_zero(i->ac,
				sizeof(char *) * (unsigned int)i->count_params, i->ac_chunk_size);
		else
			spa->params = lws_zalloc(sizeof(char *) * (unsigned int)i->count_params,
					 "spa params");
		if (!spa->params)
			goto bail3;
	}

	spa->s = lws_urldecode_s_create(spa, wsi, spa->storage, i->max_storage,
					lws_urldecode_spa_cb);
	if (!spa->s)
		goto bail4;

	if (i->count_params) {
		if (i->ac)
			spa->param_length = lwsac_use_zero(i->ac,
				sizeof(int) * (unsigned int)i->count_params, i->ac_chunk_size);
		else
			spa->param_length = lws_zalloc(sizeof(int) * (unsigned int)i->count_params,
						"spa param len");
		if (!spa->param_length)
			goto bail5;
	}

	// lwsl_notice("%s: Created SPA %p\n", __func__, spa);

	return spa;

bail5:
	lws_urldecode_s_destroy(spa, spa->s);
bail4:
	if (!i->ac)
		lws_free(spa->params);
bail3:
	if (!i->ac)
		lws_free(spa->storage);
bail2:
	if (!i->ac)
		lws_free(spa);

	if (i->ac)
		lwsac_free(i->ac);

	return NULL;
}